

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

void cleanup_pain(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar1 = 0;
  for (uVar3 = 0; uVar3 < z_info->mp_max; uVar3 = uVar3 + 1) {
    for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
      string_free(*(char **)((long)pain_messages->messages + lVar2 * 8 + lVar1));
    }
    lVar1 = lVar1 + 0x48;
  }
  mem_free(pain_messages);
  return;
}

Assistant:

static void cleanup_pain(void)
{
	int idx, i;
	for (idx = 0; idx < z_info->mp_max; idx++) {
		for (i = 0; i < 7; i++) {
			string_free((char *)pain_messages[idx].messages[i]);
		}
	}
	mem_free(pain_messages);
}